

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordered_aggregate_optimizer.cpp
# Opt level: O1

void __thiscall
duckdb::OrderedAggregateOptimizer::OrderedAggregateOptimizer
          (OrderedAggregateOptimizer *this,ExpressionRewriter *rewriter)

{
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var1;
  pointer pEVar2;
  pointer *__ptr;
  
  (this->super_Rule).rewriter = rewriter;
  this_00 = &(this->super_Rule).root;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_0248b9c0;
  _Var1._M_head_impl = (ExpressionMatcher *)operator_new(0x20);
  (_Var1._M_head_impl)->_vptr_ExpressionMatcher = (_func_int **)&PTR__ExpressionMatcher_024ac2e0;
  (_Var1._M_head_impl)->expr_class = INVALID;
  ((_Var1._M_head_impl)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       = (unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
          )0x0;
  ((_Var1._M_head_impl)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_> =
       (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>)0x0;
  (this_00->
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>)._M_t
  .super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = _Var1._M_head_impl;
  pEVar2 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->(this_00);
  pEVar2->expr_class = BOUND_AGGREGATE;
  return;
}

Assistant:

OrderedAggregateOptimizer::OrderedAggregateOptimizer(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// we match on an OR expression within a LogicalFilter node
	root = make_uniq<ExpressionMatcher>();
	root->expr_class = ExpressionClass::BOUND_AGGREGATE;
}